

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O3

HighsStatus __thiscall Highs::writeSolution(Highs *this,string *filename,HighsInt style)

{
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *__x;
  HighsLogOptions *log_options_;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *pfVar1;
  pointer pcVar2;
  size_t __n;
  HighsLp *lp;
  bool bVar3;
  HighsStatus HVar4;
  int iVar5;
  HighsStatus call_status;
  undefined4 in_register_00000014;
  FILE *__s;
  FILE *file;
  string local_180;
  HighsBasis *local_160;
  undefined8 local_158;
  HighsSolution *local_150;
  HighsLp *local_148;
  HighsFileType file_type;
  string local_138;
  string local_118;
  HighsLogOptions local_f8;
  HighsLogOptions local_98;
  
  local_158 = CONCAT44(in_register_00000014,style);
  pcVar2 = (filename->_M_dataplus)._M_p;
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,pcVar2,pcVar2 + filename->_M_string_length);
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"writeSolution","");
  HVar4 = openWriteFile(this,&local_118,&local_138,&file,&file_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  local_98.log_stream = (this->options_).super_HighsOptionsStruct.log_options.log_stream;
  local_98.output_flag = (this->options_).super_HighsOptionsStruct.log_options.output_flag;
  local_98.log_to_console = (this->options_).super_HighsOptionsStruct.log_options.log_to_console;
  local_98.log_dev_level = (this->options_).super_HighsOptionsStruct.log_options.log_dev_level;
  local_98.user_log_callback =
       (this->options_).super_HighsOptionsStruct.log_options.user_log_callback;
  local_98.user_log_callback_data =
       (this->options_).super_HighsOptionsStruct.log_options.user_log_callback_data;
  pfVar1 = &local_98.user_callback;
  __x = &(this->options_).super_HighsOptionsStruct.log_options.user_callback;
  std::
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  ::function(pfVar1,__x);
  local_98.user_callback_active =
       (this->options_).super_HighsOptionsStruct.log_options.user_callback_active;
  local_98.user_callback_data =
       (this->options_).super_HighsOptionsStruct.log_options.user_callback_data;
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"openWriteFile","");
  HVar4 = interpretCallStatus(&local_98,HVar4,kOk,&local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p);
  }
  if (local_98.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_98.user_callback.super__Function_base._M_manager)
              ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
  }
  if (HVar4 == kError) {
    return kError;
  }
  log_options_ = &(this->options_).super_HighsOptionsStruct.log_options;
  iVar5 = std::__cxx11::string::compare((char *)filename);
  if (iVar5 != 0) {
    highsLogUser(log_options_,kInfo,"Writing the solution to %s\n",(filename->_M_dataplus)._M_p);
  }
  __s = (FILE *)file;
  local_148 = &(this->model_).lp_;
  local_160 = &this->basis_;
  local_150 = &this->solution_;
  iVar5 = (int)local_158;
  writeSolutionFile(file,&this->options_,(HighsModel *)local_148,local_160,local_150,&this->info_,
                    this->model_status_,iVar5);
  if (iVar5 == 0) {
    fwrite("\n# Basis\n",9,1,__s);
    writeBasisFile(&file,local_160);
  }
  else if (iVar5 == 4) goto LAB_00212b60;
  __n = (this->options_).super_HighsOptionsStruct.ranging._M_string_length;
  __s = (FILE *)file;
  if ((__n == ::kHighsOnString_abi_cxx11_._M_string_length) &&
     ((__n == 0 ||
      (iVar5 = bcmp((this->options_).super_HighsOptionsStruct.ranging._M_dataplus._M_p,
                    ::kHighsOnString_abi_cxx11_._M_dataplus._M_p,__n), __s = (FILE *)file,
      iVar5 == 0)))) {
    lp = local_148;
    bVar3 = HighsLp::isMip(local_148);
    if ((bVar3) || ((this->model_).hessian_.dim_ != 0)) {
      highsLogUser(log_options_,kError,"Cannot determine ranging information for MIP or QP\n");
      HVar4 = kError;
      __s = (FILE *)file;
    }
    else {
      local_f8.log_stream = log_options_->log_stream;
      local_f8.output_flag = (this->options_).super_HighsOptionsStruct.log_options.output_flag;
      local_f8.log_to_console = (this->options_).super_HighsOptionsStruct.log_options.log_to_console
      ;
      local_f8.log_dev_level = (this->options_).super_HighsOptionsStruct.log_options.log_dev_level;
      local_f8.user_log_callback =
           (this->options_).super_HighsOptionsStruct.log_options.user_log_callback;
      local_f8.user_log_callback_data =
           (this->options_).super_HighsOptionsStruct.log_options.user_log_callback_data;
      pfVar1 = &local_f8.user_callback;
      std::
      function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
      ::function(pfVar1,__x);
      local_f8.user_callback_active =
           (this->options_).super_HighsOptionsStruct.log_options.user_callback_active;
      local_f8.user_callback_data =
           (this->options_).super_HighsOptionsStruct.log_options.user_callback_data;
      call_status = getRangingInterface(this);
      local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"getRangingInterface","")
      ;
      HVar4 = interpretCallStatus(&local_f8,call_status,HVar4,&local_180);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        operator_delete(local_180._M_dataplus._M_p);
      }
      if (local_f8.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_f8.user_callback.super__Function_base._M_manager)
                  ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
      }
      if ((HVar4 == kError) && (_stdout != (FILE *)file)) {
        fclose((FILE *)file);
      }
      fwrite("\n# Ranging\n",0xb,1,(FILE *)file);
      writeRangingFile(file,lp,(this->info_).super_HighsInfoStruct.objective_function_value,
                       local_160,local_150,&this->ranging_,(HighsInt)local_158);
      __s = (FILE *)file;
    }
  }
LAB_00212b60:
  if (_stdout != __s) {
    fclose(__s);
  }
  return HVar4;
}

Assistant:

HighsStatus Highs::writeSolution(const std::string& filename,
                                 const HighsInt style) {
  HighsStatus return_status = HighsStatus::kOk;
  HighsStatus call_status;
  FILE* file;
  HighsFileType file_type;
  call_status = openWriteFile(filename, "writeSolution", file, file_type);
  return_status = interpretCallStatus(options_.log_options, call_status,
                                      return_status, "openWriteFile");
  if (return_status == HighsStatus::kError) return return_status;
  // Report to user that solution is being written
  if (filename != "")
    highsLogUser(options_.log_options, HighsLogType::kInfo,
                 "Writing the solution to %s\n", filename.c_str());
  writeSolutionFile(file, options_, model_, basis_, solution_, info_,
                    model_status_, style);
  if (style == kSolutionStyleSparse)
    return returnFromWriteSolution(file, return_status);
  if (style == kSolutionStyleRaw) {
    fprintf(file, "\n# Basis\n");
    writeBasisFile(file, basis_);
  }
  if (options_.ranging == kHighsOnString) {
    if (model_.isMip() || model_.isQp()) {
      highsLogUser(options_.log_options, HighsLogType::kError,
                   "Cannot determine ranging information for MIP or QP\n");
      return_status = HighsStatus::kError;
      return returnFromWriteSolution(file, return_status);
    }
    return_status =
        interpretCallStatus(options_.log_options, this->getRangingInterface(),
                            return_status, "getRangingInterface");
    if (return_status == HighsStatus::kError)
      returnFromWriteSolution(file, return_status);
    fprintf(file, "\n# Ranging\n");
    writeRangingFile(file, model_.lp_, info_.objective_function_value, basis_,
                     solution_, ranging_, style);
  }
  return returnFromWriteSolution(file, return_status);
}